

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

string * __thiscall
nlohmann::json_abi_v3_11_2::detail::parse_error::position_string_abi_cxx11_
          (string *__return_storage_ptr__,parse_error *this,position_t *pos)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string local_58;
  string local_38;
  parse_error *local_18;
  position_t *pos_local;
  
  local_18 = this;
  pos_local = (position_t *)__return_storage_ptr__;
  std::__cxx11::to_string(&local_38,*(long *)&(this->super_exception).m + 1);
  std::__cxx11::to_string(&local_58,*(unsigned_long *)&(local_18->super_exception).id);
  concat<std::__cxx11::string,char_const(&)[10],std::__cxx11::string,char_const(&)[10],std::__cxx11::string>
            (__return_storage_ptr__,(detail *)" at line ",(char (*) [10])&local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", column ",
             (char (*) [10])&local_58,in_R9);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

static std::string position_string(const position_t& pos)
    {
        return concat(" at line ", std::to_string(pos.lines_read + 1),
                      ", column ", std::to_string(pos.chars_read_current_line));
    }